

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

Mat * ncnn::Mat::from_pixels_roi
                (uchar *pixels,int type,int w,int h,int stride,int roix,int roiy,int roiw,int roih,
                Allocator *allocator)

{
  uint uVar1;
  int in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  Mat *in_RDI;
  int in_R8D;
  uint in_stack_00000008;
  uint in_stack_00000010;
  uint in_stack_00000018;
  uint in_stack_00000020;
  int type_from;
  Allocator *in_stack_00000050;
  undefined8 in_stack_ffffffffffffff98;
  int stride_00;
  int h_00;
  int w_00;
  int type_00;
  uchar *in_stack_fffffffffffffff0;
  
  if ((((((int)in_stack_00000008 < 0) || ((int)in_stack_00000010 < 0)) ||
       ((int)in_stack_00000018 < 1)) ||
      (((int)in_stack_00000020 < 1 || (in_ECX < (int)(in_stack_00000008 + in_stack_00000018))))) ||
     (in_R8D < (int)(in_stack_00000010 + in_stack_00000020))) {
    fprintf(_stderr,"roi %d %d %d %d out of image %d %d",(ulong)in_stack_00000008,
            (ulong)in_stack_00000010,(ulong)in_stack_00000018,(ulong)in_stack_00000020,
            CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),in_ECX));
    fprintf(_stderr,"\n");
    in_RDI->data = (void *)0x0;
    in_RDI->refcount = (int *)0x0;
    in_RDI->elemsize = 0;
    in_RDI->elempack = 0;
    in_RDI->allocator = (Allocator *)0x0;
    in_RDI->dims = 0;
    in_RDI->w = 0;
    in_RDI->h = 0;
    in_RDI->d = 0;
    in_RDI->c = 0;
    in_RDI->cstep = 0;
  }
  else {
    uVar1 = in_EDX & 0xffff;
    h_00 = (int)((ulong)in_RSI >> 0x20);
    type_00 = (int)((ulong)in_RDI >> 0x20);
    stride_00 = (int)in_RSI;
    w_00 = (int)in_RDI;
    if ((uVar1 == 1) || (uVar1 == 2)) {
      from_pixels(in_stack_fffffffffffffff0,type_00,w_00,h_00,stride_00,in_stack_00000050);
    }
    else if (uVar1 == 3) {
      from_pixels(in_stack_fffffffffffffff0,type_00,w_00,h_00,stride_00,in_stack_00000050);
    }
    else if ((uVar1 == 4) || (uVar1 == 5)) {
      from_pixels(in_stack_fffffffffffffff0,type_00,w_00,h_00,stride_00,in_stack_00000050);
    }
    else {
      fprintf(_stderr,"unknown convert type %d",(ulong)in_EDX);
      fprintf(_stderr,"\n");
      in_RDI->data = (void *)0x0;
      in_RDI->refcount = (int *)0x0;
      in_RDI->elemsize = 0;
      in_RDI->elempack = 0;
      in_RDI->allocator = (Allocator *)0x0;
      in_RDI->dims = 0;
      in_RDI->w = 0;
      in_RDI->h = 0;
      in_RDI->d = 0;
      in_RDI->c = 0;
      in_RDI->cstep = 0;
    }
  }
  return in_RDI;
}

Assistant:

Mat Mat::from_pixels_roi(const unsigned char* pixels, int type, int w, int h, int stride, int roix, int roiy, int roiw, int roih, Allocator* allocator)
{
    if (roix < 0 || roiy < 0 || roiw <= 0 || roih <= 0 || roix + roiw > w || roiy + roih > h)
    {
        NCNN_LOGE("roi %d %d %d %d out of image %d %d", roix, roiy, roiw, roih, w, h);
        return Mat();
    }

    int type_from = type & PIXEL_FORMAT_MASK;

    if (type_from == PIXEL_RGB || type_from == PIXEL_BGR)
    {
        return from_pixels(pixels + roiy * stride + roix * 3, type, roiw, roih, stride, allocator);
    }
    else if (type_from == PIXEL_GRAY)
    {
        return from_pixels(pixels + roiy * stride + roix * 1, type, roiw, roih, stride, allocator);
    }
    else if (type_from == PIXEL_RGBA || type_from == PIXEL_BGRA)
    {
        return from_pixels(pixels + roiy * stride + roix * 4, type, roiw, roih, stride, allocator);
    }

    // unknown convert type
    NCNN_LOGE("unknown convert type %d", type);
    return Mat();
}